

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallProjectViaInstallScript
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  pointer pbVar6;
  int local_23c;
  string dir;
  char *local_208 [4];
  string installScript;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeScriptsVector;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_INSTALL_SCRIPT",(allocator *)&installScript);
  pcVar4 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  local_23c = 1;
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install scripts: ");
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x1e1,installScript._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&installScript);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    cmakeScriptsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmakeScriptsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmakeScriptsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar4,(allocator *)&installScript);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&cmakeScriptsVector,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    pbVar6 = cmakeScriptsVector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar6 == cmakeScriptsVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&cmakeScriptsVector);
        return 1;
      }
      std::__cxx11::string::string((string *)&installScript,(string *)pbVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install script: ");
      poVar5 = std::operator<<(poVar5,(string *)&installScript);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x1ed,dir._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      if (setDestDir) {
        dir._M_dataplus._M_p = (pointer)&dir.field_2;
        dir._M_string_length = 0;
        dir.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string
                  ((string *)&cmCPackLog_msg,"CPACK_INSTALL_PREFIX",(allocator *)local_208);
        pcVar4 = GetOption(this,(string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::string
                    ((string *)&cmCPackLog_msg,"CPACK_INSTALL_PREFIX",(allocator *)local_208);
          GetOption(this,(string *)&cmCPackLog_msg);
          std::__cxx11::string::append((char *)&dir);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        }
        std::__cxx11::string::string
                  ((string *)&cmCPackLog_msg,"CMAKE_INSTALL_PREFIX",(allocator *)local_208);
        SetOption(this,(string *)&cmCPackLog_msg,dir._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1fe,local_208[0]);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"- Setting CMAKE_INSTALL_PREFIX to \'");
        poVar5 = std::operator<<(poVar5,(string *)&dir);
        poVar5 = std::operator<<(poVar5,"\'");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x200,local_208[0]);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&dir);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&cmCPackLog_msg,"CMAKE_INSTALL_PREFIX",(allocator *)&dir);
        SetOption(this,(string *)&cmCPackLog_msg,(tempInstallDirectory->_M_dataplus)._M_p);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "- Using non-DESTDIR install... (this->SetOption)");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x207,dir._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"- Setting CMAKE_INSTALL_PREFIX to \'");
        poVar5 = std::operator<<(poVar5,(string *)tempInstallDirectory);
        poVar5 = std::operator<<(poVar5,"\'");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x20a,dir._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      }
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CMAKE_CURRENT_BINARY_DIR",(allocator *)&dir);
      SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,(tempInstallDirectory->_M_dataplus)._M_p);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CMAKE_CURRENT_SOURCE_DIR",(allocator *)&dir);
      SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,(tempInstallDirectory->_M_dataplus)._M_p);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      bVar2 = cmMakefile::ReadListFile(this->MakefileMap,installScript._M_dataplus._M_p);
      bVar3 = cmSystemTools::GetErrorOccuredFlag();
      std::__cxx11::string::~string((string *)&installScript);
      pbVar6 = pbVar6 + 1;
    } while (bVar2 && !bVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmakeScriptsVector);
    local_23c = 0;
  }
  return local_23c;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallScript(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  const char* cmakeScripts
    = this->GetOption("CPACK_INSTALL_SCRIPT");
  if ( cmakeScripts && *cmakeScripts )
    {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Install scripts: " << cmakeScripts << std::endl);
    std::vector<std::string> cmakeScriptsVector;
    cmSystemTools::ExpandListArgument(cmakeScripts,
      cmakeScriptsVector);
    std::vector<std::string>::iterator it;
    for ( it = cmakeScriptsVector.begin();
      it != cmakeScriptsVector.end();
      ++it )
      {
      std::string installScript = *it;

      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
        "- Install script: " << installScript << std::endl);

      if ( setDestDir )
        {
        // For DESTDIR based packaging, use the *project* CMAKE_INSTALL_PREFIX
        // underneath the tempInstallDirectory. The value of the project's
        // CMAKE_INSTALL_PREFIX is sent in here as the value of the
        // CPACK_INSTALL_PREFIX variable.

        std::string dir;
        if (this->GetOption("CPACK_INSTALL_PREFIX"))
          {
          dir += this->GetOption("CPACK_INSTALL_PREFIX");
          }
        this->SetOption("CMAKE_INSTALL_PREFIX", dir.c_str());
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)"
          << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'" << std::endl);
        }
      else
        {
        this->SetOption("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Using non-DESTDIR install... (this->SetOption)" << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Setting CMAKE_INSTALL_PREFIX to '" << tempInstallDirectory
          << "'" << std::endl);
        }

      this->SetOptionIfNotSet("CMAKE_CURRENT_BINARY_DIR",
        tempInstallDirectory.c_str());
      this->SetOptionIfNotSet("CMAKE_CURRENT_SOURCE_DIR",
        tempInstallDirectory.c_str());
      int res = this->MakefileMap->ReadListFile(installScript.c_str());
      if ( cmSystemTools::GetErrorOccuredFlag() || !res )
        {
        return 0;
        }
      }
    }
  return 1;
}